

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O0

int cvHandleFailure(CVodeMem cv_mem,int flag)

{
  int in_ESI;
  CVodeMem in_RDI;
  int local_4;
  
  local_4 = in_ESI;
  if (in_ESI == -0x385) {
    cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI,(char *)0xffffffeb,"CVODE","CVode",
                   "At t = %lg, the nonlinear solver was passed a NULL input.");
  }
  else if (in_ESI == -0x1f) {
    cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI,(char *)0xffffffe1,"CVODE","CVode",
                   "At t = %lg the projection function had repeated recoverable errors.");
  }
  else if (in_ESI == -0x1e) {
    cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI,(char *)0xffffffe2,"CVODE","CVode",
                   "At t = %lg the projection function failed with an unrecoverable error.");
  }
  else if (in_ESI == -0x1d) {
    cvProcessError(in_RDI,-0x1d,"CVODE","CVode","proj_mem = NULL illegal.");
  }
  else if (in_ESI == -0x1b) {
    cvProcessError(in_RDI,-0x1b,"CVODE","CVode","tout too close to t0 to start integration.");
  }
  else if (in_ESI == -0x15) {
    cvProcessError((CVodeMem)0x0,-0x15,"CVODE","CVode","cvode_mem = NULL illegal.");
  }
  else if (in_ESI == -0x10) {
    cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI,(char *)0xfffffff0,"CVODE","CVode",
                   "At t = %lg, the nonlinear solver failed in an unrecoverable manner.");
  }
  else if (in_ESI == -0xf) {
    cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI,(char *)0xfffffff1,"CVODE","CVode",
                   "At t = %lg, unable to satisfy inequality constraints.");
  }
  else if (in_ESI == -0xe) {
    cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI,(char *)0xfffffff2,"CVODE","CVode",
                   "At t = %lg, the nonlinear solver setup failed unrecoverably.");
  }
  else if (in_ESI == -0xc) {
    cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI,(char *)0xfffffff4,"CVODE","CVode",
                   "At t = %lg, the rootfinding routine failed in an unrecoverable manner.");
  }
  else if (in_ESI == -0xb) {
    cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI,(char *)0xfffffff5,"CVODE","CVode",
                   "At t = %lg, the right-hand side failed in a recoverable manner, but no recovery is possible."
                  );
  }
  else if (in_ESI == -10) {
    cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI,(char *)0xfffffff6,"CVODE","CVode",
                   "At t = %lg repeated recoverable right-hand side function errors.");
  }
  else if (in_ESI == -8) {
    cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI,(char *)0xfffffff8,"CVODE","CVode",
                   "At t = %lg, the right-hand side routine failed in an unrecoverable manner.");
  }
  else if (in_ESI == -7) {
    cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI,(char *)0xfffffff9,"CVODE","CVode",
                   "At t = %lg, the solve routine failed in an unrecoverable manner.");
  }
  else if (in_ESI == -6) {
    cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI,(char *)0xfffffffa,"CVODE","CVode",
                   "At t = %lg, the setup routine failed in an unrecoverable manner.");
  }
  else if (in_ESI == -4) {
    cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI->cv_h,(char *)in_RDI,(char *)0xfffffffc,
                   "CVODE","CVode",
                   "At t = %lg and h = %lg, the corrector convergence test failed repeatedly or with |h| = hmin."
                  );
  }
  else if (in_ESI == -3) {
    cvProcessError((CVodeMem)in_RDI->cv_tn,(int)in_RDI->cv_h,(char *)in_RDI,(char *)0xfffffffd,
                   "CVODE","CVode",
                   "At t = %lg and h = %lg, the error test failed repeatedly or with |h| = hmin.");
  }
  else {
    cvProcessError(in_RDI,-99,"CVODE","CVode",
                   "CVODE encountered an unrecognized error. Please report this to the SUNDIALS developers at sundials-users@llnl.gov"
                  );
    local_4 = -99;
  }
  return local_4;
}

Assistant:

static int cvHandleFailure(CVodeMem cv_mem, int flag)
{

  /* Set vector of  absolute weighted local errors */
  /*
  N_VProd(acor, ewt, tempv);
  N_VAbs(tempv, tempv);
  */

  /* Depending on flag, print error message and return error flag */
  switch (flag) {
  case CV_ERR_FAILURE:
    cvProcessError(cv_mem, CV_ERR_FAILURE, "CVODE", "CVode",
                   MSGCV_ERR_FAILS, cv_mem->cv_tn, cv_mem->cv_h);
    break;
  case CV_CONV_FAILURE:
    cvProcessError(cv_mem, CV_CONV_FAILURE, "CVODE", "CVode",
                   MSGCV_CONV_FAILS, cv_mem->cv_tn, cv_mem->cv_h);
    break;
  case CV_LSETUP_FAIL:
    cvProcessError(cv_mem, CV_LSETUP_FAIL, "CVODE", "CVode",
                   MSGCV_SETUP_FAILED, cv_mem->cv_tn);
    break;
  case CV_LSOLVE_FAIL:
    cvProcessError(cv_mem, CV_LSOLVE_FAIL, "CVODE", "CVode",
                   MSGCV_SOLVE_FAILED, cv_mem->cv_tn);
    break;
  case CV_RHSFUNC_FAIL:
    cvProcessError(cv_mem, CV_RHSFUNC_FAIL, "CVODE", "CVode",
                   MSGCV_RHSFUNC_FAILED, cv_mem->cv_tn);
    break;
  case CV_UNREC_RHSFUNC_ERR:
    cvProcessError(cv_mem, CV_UNREC_RHSFUNC_ERR, "CVODE", "CVode",
                   MSGCV_RHSFUNC_UNREC, cv_mem->cv_tn);
    break;
  case CV_REPTD_RHSFUNC_ERR:
    cvProcessError(cv_mem, CV_REPTD_RHSFUNC_ERR, "CVODE", "CVode",
                   MSGCV_RHSFUNC_REPTD, cv_mem->cv_tn);
    break;
  case CV_RTFUNC_FAIL:
    cvProcessError(cv_mem, CV_RTFUNC_FAIL, "CVODE", "CVode",
                   MSGCV_RTFUNC_FAILED, cv_mem->cv_tn);
    break;
  case CV_TOO_CLOSE:
    cvProcessError(cv_mem, CV_TOO_CLOSE, "CVODE", "CVode",
                   MSGCV_TOO_CLOSE);
    break;
  case CV_MEM_NULL:
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVode",
                   MSGCV_NO_MEM);
    break;
  case SUN_NLS_MEM_NULL:
    cvProcessError(cv_mem, CV_MEM_NULL, "CVODE", "CVode",
                   MSGCV_NLS_INPUT_NULL, cv_mem->cv_tn);
    break;
  case CV_NLS_SETUP_FAIL:
    cvProcessError(cv_mem, CV_NLS_SETUP_FAIL, "CVODE", "CVode",
                   MSGCV_NLS_SETUP_FAILED, cv_mem->cv_tn);
    break;
  case CV_CONSTR_FAIL:
    cvProcessError(cv_mem, CV_CONSTR_FAIL, "CVODE", "CVode",
                   MSGCV_FAILED_CONSTR, cv_mem->cv_tn);
    break;
  case CV_NLS_FAIL:
    cvProcessError(cv_mem, CV_NLS_FAIL, "CVODE", "CVode",
                   MSGCV_NLS_FAIL, cv_mem->cv_tn);
    break;
  case CV_PROJ_MEM_NULL:
    cvProcessError(cv_mem, CV_PROJ_MEM_NULL, "CVODE", "CVode",
                   MSG_CV_PROJ_MEM_NULL);
    break;
  case CV_PROJFUNC_FAIL:
    cvProcessError(cv_mem, CV_PROJFUNC_FAIL, "CVODE", "CVode",
                   MSG_CV_PROJFUNC_FAIL, cv_mem->cv_tn);
    break;
  case CV_REPTD_PROJFUNC_ERR:
    cvProcessError(cv_mem, CV_REPTD_PROJFUNC_ERR, "CVODE", "CVode",
                   MSG_CV_REPTD_PROJFUNC_ERR, cv_mem->cv_tn);
    break;
  default:
    /* This return should never happen */
    cvProcessError(cv_mem, CV_UNRECOGNIZED_ERR, "CVODE", "CVode",
                   "CVODE encountered an unrecognized error. Please report this to the SUNDIALS developers at sundials-users@llnl.gov");
    return (CV_UNRECOGNIZED_ERR);
  }

  return(flag);
}